

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

bool __thiscall
Catch::TeamCityReporter::assertionEnded(TeamCityReporter *this,AssertionStats *assertionStats)

{
  OfType OVar1;
  pointer pMVar2;
  TeamCityReporter *pTVar3;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar4;
  size_t sVar5;
  ostream *poVar6;
  ulong uVar7;
  MessageInfo *messageInfo;
  pointer pMVar8;
  char *pcVar9;
  ReusableStringStream msg;
  char local_a9;
  string local_a8;
  string local_88;
  string local_68;
  ReusableStringStream local_48;
  TeamCityReporter *local_38;
  
  if ((((assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok) ||
     (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0))
  goto LAB_0019fb4a;
  pSVar4 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar5 = StringStreams::add(&pSVar4->super_StringStreams);
  local_48.m_index = sVar5;
  pSVar4 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  poVar6 = (ostream *)
           (pSVar4->super_StringStreams).m_streams.
           super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar5].m_ptr;
  local_48.m_oss = poVar6;
  if (this->m_headerPrintedForThisSection == false) {
    printSectionHeader(this,poVar6);
  }
  this->m_headerPrintedForThisSection = true;
  local_a8._M_dataplus._M_p = (assertionStats->assertionResult).m_info.lineInfo.file;
  local_a8._M_string_length = (assertionStats->assertionResult).m_info.lineInfo.line;
  operator<<(poVar6,(SourceLineInfo *)&local_a8);
  local_88._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_88,1);
  OVar1 = (assertionStats->assertionResult).m_resultData.resultType;
  uVar7 = (ulong)(uint)OVar1;
  if (OVar1 < ThrewException) {
    if (FailureBit < OVar1) {
      if (OVar1 == ExpressionFailed) {
        pcVar9 = "expression failed";
      }
      else {
        if (OVar1 != ExplicitFailure) {
          if (OVar1 == Exception) goto LAB_0019f6ff;
          goto LAB_0019f784;
        }
        uVar7 = 0x10;
        pcVar9 = "explicit failure";
      }
      goto LAB_0019f77c;
    }
    if ((uint)OVar1 < 3) {
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_88);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_88._M_string_length,"Internal error in TeamCity reporter",0x23);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a8);
    }
    if ((OVar1 == Unknown) || (OVar1 == FailureBit)) {
LAB_0019f6ff:
      ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_88);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_88._M_string_length,"Not implemented",0xf);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_a8);
    }
  }
  else {
    if (OVar1 == ThrewException) {
      uVar7 = 0x14;
      pcVar9 = "unexpected exception";
    }
    else if (OVar1 == DidntThrowException) {
      uVar7 = 0x2e;
      pcVar9 = "no exception was thrown where one was expected";
    }
    else {
      if (OVar1 != FatalErrorCondition) goto LAB_0019f784;
      uVar7 = 0x15;
      pcVar9 = "fatal error condition";
    }
LAB_0019f77c:
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,uVar7);
  }
LAB_0019f784:
  if ((long)(assertionStats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(assertionStats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start == 0x48) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," with message:",0xe);
  }
  if (1 < (ulong)(((long)(assertionStats->infoMessages).
                         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(assertionStats->infoMessages).
                         super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7)) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," with messages:",0xf);
  }
  pMVar8 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = this;
  if (pMVar8 != pMVar2) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n  \"",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(pMVar8->message)._M_dataplus._M_p,(pMVar8->message)._M_string_length);
      local_a8._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_a8,1);
      pMVar8 = pMVar8 + 1;
    } while (pMVar8 != pMVar2);
  }
  pTVar3 = local_38;
  if ((assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n  ",3);
    AssertionResult::getExpressionInMacro_abi_cxx11_(&local_a8,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nwith expansion:\n  ",0x13);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_88,&assertionStats->assertionResult);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                       local_88._M_dataplus._M_p._0_1_),local_88._M_string_length);
    local_68._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_68,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                      local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((((pTVar3->super_StreamingReporterBase).currentTestCaseInfo)->properties &
      (MayFail|ShouldFail)) == None) {
    poVar6 = (pTVar3->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"##teamcity[testFailed",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," name=\'",7);
    anon_unknown_23::escape
              (&local_a8,&((pTVar3->super_StreamingReporterBase).currentTestCaseInfo)->name);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    local_88._M_dataplus._M_p._0_1_ = 0x27;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_88,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," message=\'",10);
    std::__cxx11::stringbuf::str();
    anon_unknown_23::escape(&local_88,&local_68);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                                local_88._M_dataplus._M_p._0_1_),
                        local_88._M_string_length);
    local_a9 = '\'';
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_a9,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_48.m_oss,"- failure ignore as test marked as \'ok to fail\'\n",0x30);
    poVar6 = (pTVar3->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"##teamcity[testIgnored",0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," name=\'",7);
    anon_unknown_23::escape
              (&local_a8,&((pTVar3->super_StreamingReporterBase).currentTestCaseInfo)->name);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
    local_88._M_dataplus._M_p._0_1_ = 0x27;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_88,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," message=\'",10);
    std::__cxx11::stringbuf::str();
    anon_unknown_23::escape(&local_88,&local_68);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,
                                                local_88._M_dataplus._M_p._0_1_),
                        local_88._M_string_length);
    local_a9 = '\'';
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_a9,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]\n",2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
      &local_88.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                    local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_68._M_dataplus._M_p._1_7_,local_68._M_dataplus._M_p._0_1_) !=
      &local_68.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_68._M_dataplus._M_p._1_7_,local_68._M_dataplus._M_p._0_1_),
                    local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_48);
LAB_0019fb4a:
  std::ostream::flush();
  return true;
}

Assistant:

bool TeamCityReporter::assertionEnded(AssertionStats const &assertionStats) {
        AssertionResult const &result = assertionStats.assertionResult;
        if (!result.isOk()) {

            ReusableStringStream msg;
            if (!m_headerPrintedForThisSection)
                printSectionHeader(msg.get());
            m_headerPrintedForThisSection = true;

            msg << result.getSourceInfo() << '\n';

            switch (result.getResultType()) {
            case ResultWas::ExpressionFailed:
                msg << "expression failed";
                break;
            case ResultWas::ThrewException:
                msg << "unexpected exception";
                break;
            case ResultWas::FatalErrorCondition:
                msg << "fatal error condition";
                break;
            case ResultWas::DidntThrowException:
                msg << "no exception was thrown where one was expected";
                break;
            case ResultWas::ExplicitFailure:
                msg << "explicit failure";
                break;

                // We shouldn't get here because of the isOk() test
            case ResultWas::Ok:
            case ResultWas::Info:
            case ResultWas::Warning:
                CATCH_ERROR("Internal error in TeamCity reporter");
                // These cases are here to prevent compiler warnings
            case ResultWas::Unknown:
            case ResultWas::FailureBit:
            case ResultWas::Exception:
                CATCH_ERROR("Not implemented");
            }
            if (assertionStats.infoMessages.size() == 1)
                msg << " with message:";
            if (assertionStats.infoMessages.size() > 1)
                msg << " with messages:";
            for (auto const &messageInfo : assertionStats.infoMessages)
                msg << "\n  \"" << messageInfo.message << '"';


            if (result.hasExpression()) {
                msg <<
                    "\n  " << result.getExpressionInMacro() << "\n"
                    "with expansion:\n"
                    "  " << result.getExpandedExpression() << '\n';
            }

            if (currentTestCaseInfo->okToFail()) {
                msg << "- failure ignore as test marked as 'ok to fail'\n";
                stream << "##teamcity[testIgnored"
                    << " name='" << escape(currentTestCaseInfo->name) << '\''
                    << " message='" << escape(msg.str()) << '\''
                    << "]\n";
            }
            else {
                stream << "##teamcity[testFailed"
                    << " name='" << escape(currentTestCaseInfo->name) << '\''
                    << " message='" << escape(msg.str()) << '\''
                    << "]\n";
            }
        }
        stream.flush();
        return true;
    }